

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::convertInto
          (ParserResult *__return_storage_ptr__,string *source,string *target)

{
  ParseResultType local_24;
  string *local_20;
  string *target_local;
  string *source_local;
  
  local_20 = target;
  target_local = source;
  source_local = (string *)__return_storage_ptr__;
  ::std::__cxx11::string::operator=((string *)target,(string *)source);
  local_24 = Matched;
  BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
            (__return_storage_ptr__,&local_24);
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, std::string& target ) -> ParserResult {
        target = source;
        return ParserResult::ok( ParseResultType::Matched );
    }